

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_SetPublishingMode
               (UA_Server *server,UA_Session *session,UA_SetPublishingModeRequest *request,
               UA_SetPublishingModeResponse *response)

{
  UA_Subscription *size_00;
  UA_StatusCode *pUVar1;
  UA_Subscription *pUVar2;
  uint local_80;
  uint local_78;
  uint local_74;
  UA_Subscription *sub;
  size_t i;
  size_t size;
  UA_SetPublishingModeResponse *response_local;
  UA_SetPublishingModeRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_78 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_74 = 0;
    }
    else {
      local_74 = session->channel->connection->sockfd;
    }
    local_78 = local_74;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing SetPublishingModeRequest"
               ,(ulong)local_78,(ulong)local_80,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  if (request->subscriptionIdsSize == 0) {
    (response->responseHeader).serviceResult = 0x800f0000;
  }
  else {
    size_00 = (UA_Subscription *)request->subscriptionIdsSize;
    pUVar1 = (UA_StatusCode *)UA_Array_new((size_t)size_00,UA_TYPES + 0x12);
    response->results = pUVar1;
    if (response->results == (UA_StatusCode *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
    }
    else {
      response->resultsSize = (size_t)size_00;
      for (sub = (UA_Subscription *)0x0; sub < size_00;
          sub = (UA_Subscription *)((long)&(sub->listEntry).le_next + 1)) {
        pUVar2 = UA_Session_getSubscriptionByID(session,request->subscriptionIds[(long)sub]);
        if (pUVar2 == (UA_Subscription *)0x0) {
          response->results[(long)sub] = 0x80280000;
        }
        else if ((pUVar2->publishingEnabled & 1U) != (request->publishingEnabled & 1U)) {
          pUVar2->publishingEnabled = (UA_Boolean)(request->publishingEnabled & 1);
          pUVar2->currentLifetimeCount = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void
Service_SetPublishingMode(UA_Server *server, UA_Session *session,
                          const UA_SetPublishingModeRequest *request,
                          UA_SetPublishingModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing SetPublishingModeRequest");
    if(request->subscriptionIdsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->subscriptionIdsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i) {
        UA_Subscription *sub =
            UA_Session_getSubscriptionByID(session, request->subscriptionIds[i]);
        if(!sub) {
            response->results[i] = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
            continue;
        }
        if(sub->publishingEnabled != request->publishingEnabled) {
            sub->publishingEnabled = request->publishingEnabled;
            sub->currentLifetimeCount = 0; /* Reset the subscription lifetime */
        }
    }
}